

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool remap_generic(Compiler *compiler,SmallVector<spirv_cross::Resource,_8UL> *resources,
                  Remap *remap)

{
  size_t sVar1;
  __type _Var2;
  long lVar3;
  Resource *pRVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Resource *pRVar5;
  long lVar6;
  
  pRVar4 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
  sVar1 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
  lVar6 = 0;
  for (lVar3 = (long)sVar1 >> 2;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pRVar4->name)._M_dataplus._M_p + lVar6), 0 < lVar3; lVar3 = lVar3 + -1) {
    _Var2 = std::operator==(__lhs,&remap->src_name);
    if (_Var2) {
      pRVar5 = (Resource *)((long)&(pRVar4->id).id + lVar6);
      goto LAB_001124f6;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pRVar4[1].name._M_dataplus._M_p + lVar6),&remap->src_name);
    if (_Var2) {
      pRVar5 = (Resource *)((long)&pRVar4[1].id.id + lVar6);
      goto LAB_001124f6;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pRVar4[2].name._M_dataplus._M_p + lVar6),&remap->src_name);
    if (_Var2) {
      pRVar5 = (Resource *)((long)&pRVar4[2].id.id + lVar6);
      goto LAB_001124f6;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pRVar4[3].name._M_dataplus._M_p + lVar6),&remap->src_name);
    if (_Var2) {
      pRVar5 = (Resource *)((long)&pRVar4[3].id.id + lVar6);
      goto LAB_001124f6;
    }
    lVar6 = lVar6 + 0xc0;
  }
  lVar3 = (long)(sVar1 * 0x30 - lVar6) / 0x30;
  pRVar5 = (Resource *)((long)&(pRVar4->id).id + lVar6);
  if (lVar3 == 1) {
LAB_001124e0:
    _Var2 = std::operator==(&pRVar5->name,&remap->src_name);
    if (_Var2) goto LAB_001124f6;
  }
  else {
    if (lVar3 == 3) {
      _Var2 = std::operator==(__lhs,&remap->src_name);
      if (_Var2) goto LAB_001124f6;
      pRVar5 = (Resource *)((long)&pRVar4[1].id.id + lVar6);
LAB_001124cb:
      _Var2 = std::operator==(&pRVar5->name,&remap->src_name);
      if (_Var2) goto LAB_001124f6;
      pRVar5 = pRVar5 + 1;
      goto LAB_001124e0;
    }
    if (lVar3 == 2) goto LAB_001124cb;
  }
  pRVar5 = pRVar4 + sVar1;
LAB_001124f6:
  pRVar4 = (resources->super_VectorView<spirv_cross::Resource>).ptr +
           (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
  if (pRVar5 != pRVar4) {
    spirv_cross::Compiler::set_remapped_variable_state(compiler,(VariableID)(pRVar5->id).id,true);
    spirv_cross::Compiler::set_name(compiler,(ID)(pRVar5->id).id,&remap->dst_name);
    spirv_cross::Compiler::set_subpass_input_remapped_components
              (compiler,(VariableID)(pRVar5->id).id,remap->components);
  }
  return pRVar5 != pRVar4;
}

Assistant:

static bool remap_generic(Compiler &compiler, const SmallVector<Resource> &resources, const Remap &remap)
{
	auto itr =
	    find_if(begin(resources), end(resources), [&remap](const Resource &res) { return res.name == remap.src_name; });

	if (itr != end(resources))
	{
		compiler.set_remapped_variable_state(itr->id, true);
		compiler.set_name(itr->id, remap.dst_name);
		compiler.set_subpass_input_remapped_components(itr->id, remap.components);
		return true;
	}
	else
		return false;
}